

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::BeginValue(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
             *this)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  PatternValidatorType PVar1;
  uint uVar2;
  SchemaType **ppSVar3;
  ISchemaValidator **ppIVar4;
  bool bVar5;
  int iVar6;
  SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *pSVar7;
  SchemaType *this_01;
  SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *pSVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar9;
  SizeType i;
  ulong uVar10;
  
  if ((this->schemaStack_).stackTop_ == (this->schemaStack_).stack_) {
    PushSchema(this,this->root_);
  }
  else {
    this_00 = &this->schemaStack_;
    pSVar7 = internal::Stack<rapidjson::CrtAllocator>::
             Top<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                       (this_00);
    if (pSVar7->inArray == true) {
      pSVar7 = internal::Stack<rapidjson::CrtAllocator>::
               Top<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                         (this_00);
      internal::TokenHelper<rapidjson::internal::Stack<rapidjson::CrtAllocator>,_char>::
      AppendIndexToken(&this->documentStack_,pSVar7->arrayElementIndex);
    }
    this_01 = CurrentSchema(this);
    pSVar7 = internal::Stack<rapidjson::CrtAllocator>::
             Top<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                       (this_00);
    bVar5 = internal::
            Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
            ::BeginValue(this_01,pSVar7);
    if ((!bVar5) && ((this->flags_ & 1) == 0)) {
      return false;
    }
    pSVar7 = internal::Stack<rapidjson::CrtAllocator>::
             Top<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                       (this_00);
    uVar9 = (ulong)pSVar7->patternPropertiesSchemaCount;
    pSVar7 = internal::Stack<rapidjson::CrtAllocator>::
             Top<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                       (this_00);
    ppSVar3 = pSVar7->patternPropertiesSchemas;
    pSVar7 = internal::Stack<rapidjson::CrtAllocator>::
             Top<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                       (this_00);
    PVar1 = pSVar7->valuePatternValidatorType;
    pSVar7 = internal::Stack<rapidjson::CrtAllocator>::
             Top<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                       (this_00);
    bVar5 = pSVar7->valueUniqueness;
    pSVar7 = internal::Stack<rapidjson::CrtAllocator>::
             Top<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                       (this_00);
    if (pSVar7->valueSchema == (SchemaType *)0x0) {
      __assert_fail("CurrentContext().valueSchema",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/schema.h"
                    ,0xbb3,
                    "bool rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>>::BeginValue() [SchemaDocumentType = rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>, OutputHandler = rapidjson::BaseReaderHandler<>, StateAllocator = rapidjson::CrtAllocator]"
                   );
    }
    pSVar7 = internal::Stack<rapidjson::CrtAllocator>::
             Top<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                       (this_00);
    PushSchema(this,pSVar7->valueSchema);
    if (uVar9 != 0) {
      pSVar7 = internal::Stack<rapidjson::CrtAllocator>::
               Top<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                         (this_00);
      pSVar7->objectPatternValidatorType = PVar1;
      pSVar7 = internal::Stack<rapidjson::CrtAllocator>::
               Top<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                         (this_00);
      pSVar8 = internal::Stack<rapidjson::CrtAllocator>::
               Top<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                         (this_00);
      iVar6 = (*(this->
                super_ISchemaStateFactory<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
                )._vptr_ISchemaStateFactory[7])(this);
      pSVar7->patternPropertiesValidators = (ISchemaValidator **)CONCAT44(extraout_var,iVar6);
      memset((ISchemaValidator **)CONCAT44(extraout_var,iVar6),0,uVar9 * 8);
      for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        iVar6 = (*(this->
                  super_ISchemaStateFactory<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
                  )._vptr_ISchemaStateFactory[2])(this,ppSVar3[uVar10],1);
        ppIVar4 = pSVar7->patternPropertiesValidators;
        uVar2 = pSVar8->patternPropertiesValidatorCount;
        pSVar8->patternPropertiesValidatorCount = uVar2 + 1;
        ppIVar4[uVar2] = (ISchemaValidator *)CONCAT44(extraout_var_00,iVar6);
      }
    }
    pSVar7 = internal::Stack<rapidjson::CrtAllocator>::
             Top<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                       (this_00);
    pSVar7->arrayUniqueness = bVar5;
  }
  return true;
}

Assistant:

bool BeginValue() {
        RAPIDJSON_SCHEMA_PRINT(Method, "GenericSchemaValidator::BeginValue");
        if (schemaStack_.Empty())
            PushSchema(root_);
        else {
            if (CurrentContext().inArray)
                internal::TokenHelper<internal::Stack<StateAllocator>, Ch>::AppendIndexToken(documentStack_, CurrentContext().arrayElementIndex);

            if (!CurrentSchema().BeginValue(CurrentContext()) && !GetContinueOnErrors())
                return false;

            SizeType count = CurrentContext().patternPropertiesSchemaCount;
            const SchemaType** sa = CurrentContext().patternPropertiesSchemas;
            typename Context::PatternValidatorType patternValidatorType = CurrentContext().valuePatternValidatorType;
            bool valueUniqueness = CurrentContext().valueUniqueness;
            RAPIDJSON_ASSERT(CurrentContext().valueSchema);
            PushSchema(*CurrentContext().valueSchema);

            if (count > 0) {
                CurrentContext().objectPatternValidatorType = patternValidatorType;
                ISchemaValidator**& va = CurrentContext().patternPropertiesValidators;
                SizeType& validatorCount = CurrentContext().patternPropertiesValidatorCount;
                va = static_cast<ISchemaValidator**>(MallocState(sizeof(ISchemaValidator*) * count));
                std::memset(va, 0, sizeof(ISchemaValidator*) * count);
                for (SizeType i = 0; i < count; i++)
                    va[validatorCount++] = CreateSchemaValidator(*sa[i], true);  // Inherit continueOnError
            }

            CurrentContext().arrayUniqueness = valueUniqueness;
        }
        return true;
    }